

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlValidateOneAttribute(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_98;
  PyObject *local_90;
  PyObject *local_88;
  PyObject *local_80;
  undefined8 local_78;
  xmlChar *value;
  PyObject *pyobj_attr;
  xmlAttrPtr attr;
  PyObject *pyobj_elem;
  xmlNodePtr elem;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  PyObject *pyobj_ctxt;
  xmlValidCtxtPtr ctxt;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlValidateOneAttribute");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"OOOOz:xmlValidateOneAttribute",&doc,&elem,&attr,&value,&local_78);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (doc == (xmlDocPtr)&_Py_NoneStruct) {
        local_80 = (PyObject *)0x0;
      }
      else {
        local_80 = (PyObject *)doc->name;
      }
      pyobj_ctxt = local_80;
      if (elem == (xmlNodePtr)&_Py_NoneStruct) {
        local_88 = (PyObject *)0x0;
      }
      else {
        local_88 = (PyObject *)elem->name;
      }
      pyobj_doc = local_88;
      if (attr == (xmlAttrPtr)&_Py_NoneStruct) {
        local_90 = (PyObject *)0x0;
      }
      else {
        local_90 = (PyObject *)attr->name;
      }
      pyobj_elem = local_90;
      if (value == &_Py_NoneStruct) {
        local_98 = (PyObject *)0x0;
      }
      else {
        local_98 = *(PyObject **)(value + 0x10);
      }
      pyobj_attr = local_98;
      ctxt._4_4_ = xmlValidateOneAttribute(local_80,local_88,local_90,local_98,local_78);
      self_local = libxml_intWrap(ctxt._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidateOneAttribute(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlAttrPtr attr;
    PyObject *pyobj_attr;
    xmlChar * value;

    if (libxml_deprecationWarning("xmlValidateOneAttribute") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOOOz:xmlValidateOneAttribute", &pyobj_ctxt, &pyobj_doc, &pyobj_elem, &pyobj_attr, &value))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);
    attr = (xmlAttrPtr) PyxmlNode_Get(pyobj_attr);

    c_retval = xmlValidateOneAttribute(ctxt, doc, elem, attr, value);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}